

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O1

void test_char<wchar_t>(void)

{
  __locale_t __dataset;
  ostream *poVar1;
  long lVar2;
  locale l;
  generator gen;
  string name;
  locale l_1;
  string names [2];
  string local_1b0 [8];
  generator local_1a8 [8];
  char *local_1a0;
  long local_198;
  char local_190 [16];
  string local_180;
  string local_160;
  string local_140 [8];
  undefined1 *local_138;
  long lStack_130;
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [24];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  booster::locale::generator::generator(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing at least C",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"en_US.UTF-8","");
  booster::locale::generator::generate(local_1b0);
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"b","");
  test_one<wchar_t>((locale *)local_1b0,&local_50,&local_70,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"a","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"a","");
  test_one<wchar_t>((locale *)local_1b0,&local_90,&local_b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_1a0 = local_190;
  local_198 = 0;
  local_190[0] = '\0';
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"en_US.UTF-8","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"en_US.ISO8859-1","");
  lVar2 = 0;
  do {
    __dataset = newlocale(0x1fbf,*(char **)((long)&local_138 + lVar2),(__locale_t)0x0);
    if (__dataset == (__locale_t)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)((long)&local_138 + lVar2),
                          *(long *)((long)&lStack_130 + lVar2));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," not supported, skipping",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
    else {
      freelocale(__dataset);
      std::__cxx11::string::_M_assign((string *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Testing ",10);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_1a0,local_198);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      booster::locale::generator::generate(local_140);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"a","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,anon_var_dwarf_3abd,anon_var_dwarf_3abd + 2);
      test_one<wchar_t>((locale *)local_140,&local_160,&local_d0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,anon_var_dwarf_3abd,anon_var_dwarf_3abd + 2);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,anon_var_dwarf_3a47 + 0x28,anon_var_dwarf_3a47 + 0x29);
      test_one<wchar_t>((locale *)local_140,&local_180,&local_f0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      std::locale::~locale((locale *)local_140);
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 == 0x20);
  lVar2 = 0;
  do {
    if (local_108 + lVar2 != *(undefined1 **)((long)local_118 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_118 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  std::locale::~locale((locale *)local_1b0);
  booster::locale::generator::~generator(local_1a8);
  return;
}

Assistant:

void test_char()
{
    booster::locale::generator gen;
    
    std::cout << "- Testing at least C" << std::endl;

    std::locale l = gen("en_US.UTF-8");

    test_one<CharType>(l,"a","b",-1);
    test_one<CharType>(l,"a","a",0);

    std::string name;


    #if !defined(__APPLE__) && !defined(__FreeBSD__)
    std::string names[] = { "en_US.UTF-8", "en_US.ISO8859-1" };
    for(unsigned i=0;i<sizeof(names)/sizeof(names[0]);i++) {
        if(have_locale(names[i])) {
            name = names[i];
            std::cout << "- Testing " << name << std::endl;
            std::locale l=gen(name);
            test_one<CharType>(l,"a","ç",-1);
            test_one<CharType>(l,"ç","d",-1);
        }
        else {
            std::cout << "- " << names[i] << " not supported, skipping" << std::endl;
        }
    }
    #else
    std::cout << "- Collation is broken on this OS C standard library, skipping" << std::endl;
    #endif
}